

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::SetColumnOffset(int column_index,float offset)

{
  int iVar1;
  ImGuiOldColumns *pIVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  ImGuiOldColumnData *pIVar5;
  ImGuiOldColumnData *pIVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  
  while( true ) {
    pIVar4 = GImGui;
    pIVar2 = (GImGui->CurrentWindow->DC).CurrentColumns;
    if (pIVar2 == (ImGuiOldColumns *)0x0) {
      __assert_fail("columns != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_tables.cpp"
                    ,0xea5,"void ImGui::SetColumnOffset(int, float)");
    }
    if (column_index < 0) {
      column_index = pIVar2->Current;
    }
    iVar1 = (pIVar2->Columns).Size;
    if (iVar1 <= column_index) {
      __assert_fail("column_index < columns->Columns.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_tables.cpp"
                    ,0xea9,"void ImGui::SetColumnOffset(int, float)");
    }
    if ((pIVar2->Flags & 4U) == 0) {
      bVar3 = column_index < pIVar2->Count + -1;
    }
    else {
      bVar3 = false;
    }
    fVar9 = 0.0;
    if (bVar3) {
      uVar8 = column_index;
      if (column_index < 0) {
        uVar8 = pIVar2->Current;
      }
      uVar7 = uVar8 + 1;
      if (pIVar2->IsBeingResized == false) {
        if ((iVar1 <= (int)uVar7 || (int)uVar8 < -1) || ((int)uVar8 < 0)) break;
        pIVar5 = (pIVar2->Columns).Data;
        pIVar6 = pIVar5 + uVar7;
        pIVar5 = pIVar5 + uVar8;
      }
      else {
        if ((iVar1 <= (int)uVar7 || (int)uVar8 < -1) || ((int)uVar8 < 0)) break;
        pIVar5 = (pIVar2->Columns).Data;
        pIVar6 = (ImGuiOldColumnData *)&pIVar5[uVar7].OffsetNormBeforeResize;
        pIVar5 = (ImGuiOldColumnData *)&pIVar5[uVar8].OffsetNormBeforeResize;
      }
      fVar9 = (pIVar2->OffMaxX - pIVar2->OffMinX) * (pIVar6->OffsetNorm - pIVar5->OffsetNorm);
    }
    if (((pIVar2->Flags & 8U) == 0) &&
       (fVar10 = pIVar2->OffMaxX -
                 (float)(pIVar2->Count - column_index) * (GImGui->Style).ColumnsMinSpacing,
       fVar10 <= offset)) {
      offset = fVar10;
    }
    if (column_index < 0) break;
    (pIVar2->Columns).Data[(uint)column_index].OffsetNorm =
         (offset - pIVar2->OffMinX) / (pIVar2->OffMaxX - pIVar2->OffMinX);
    if (!bVar3) {
      return;
    }
    column_index = column_index + 1;
    fVar10 = (pIVar4->Style).ColumnsMinSpacing;
    uVar8 = -(uint)(fVar9 <= fVar10);
    offset = offset + (float)(~uVar8 & (uint)fVar9 | (uint)fVar10 & uVar8);
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                ,0x703,"T &ImVector<ImGuiOldColumnData>::operator[](int) [T = ImGuiOldColumnData]");
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    IM_ASSERT(column_index < columns->Columns.Size);

    const bool preserve_width = !(columns->Flags & ImGuiOldColumnFlags_NoPreserveWidths) && (column_index < columns->Count - 1);
    const float width = preserve_width ? GetColumnWidthEx(columns, column_index, columns->IsBeingResized) : 0.0f;

    if (!(columns->Flags & ImGuiOldColumnFlags_NoForceWithinWindow))
        offset = ImMin(offset, columns->OffMaxX - g.Style.ColumnsMinSpacing * (columns->Count - column_index));
    columns->Columns[column_index].OffsetNorm = GetColumnNormFromOffset(columns, offset - columns->OffMinX);

    if (preserve_width)
        SetColumnOffset(column_index + 1, offset + ImMax(g.Style.ColumnsMinSpacing, width));
}